

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-bool.cpp
# Opt level: O1

void __thiscall BoolLinearLE<4>::BoolLinearLE(BoolLinearLE<4> *this,vec<BoolView> *_x,IntView<4> _y)

{
  uint uVar1;
  IntVar *pIVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  BoolLinearLE<4> *local_38;
  
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__Propagator_0020fe18;
  (this->super_Propagator).prop_id = engine.propagators.sz;
  (this->super_Propagator).priority = 0;
  (this->super_Propagator).satisfied = '\0';
  (this->super_Propagator).in_queue = false;
  local_38 = this;
  vec<Propagator_*>::push(&engine.propagators,(Propagator **)&local_38);
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__BoolLinearLE_002100a0;
  vec<BoolView>::vec<BoolView>(&this->x,_x);
  (this->y).var = _y.var;
  (this->y).a = (int)_y._8_8_;
  (this->y).b = (int)((ulong)_y._8_8_ >> 0x20);
  (this->ones).v = 0;
  (this->ps).sz = 0;
  (this->ps).cap = 0;
  (this->ps).data = (Lit *)0x0;
  uVar1 = (this->x).sz;
  uVar3 = (ulong)uVar1;
  if (uVar1 != 0) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      BoolView::attach((BoolView *)
                       ((long)&(((this->x).data)->super_Var).super_Branching._vptr_Branching + lVar4
                       ),&this->super_Propagator,(int)uVar5,2);
      uVar5 = uVar5 + 1;
      uVar3 = (ulong)(this->x).sz;
      lVar4 = lVar4 + 0x10;
    } while (uVar5 < uVar3);
  }
  pIVar2 = (this->y).var;
  (*(pIVar2->super_Var).super_Branching._vptr_Branching[7])(pIVar2,this,uVar3,4);
  return;
}

Assistant:

BoolLinearLE(vec<BoolView>& _x, IntView<U> _y) : x(_x), y(_y), ones(0) {
		for (unsigned int i = 0; i < x.size(); i++) {
			x[i].attach(this, i, EVENT_L);
		}
		y.attach(this, x.size(), EVENT_U);
	}